

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testZip(DataFileTest *this)

{
  long *plVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long lVar4;
  size_t i;
  long lVar5;
  ulong local_120;
  vector<int,_std::allocator<int>_> found;
  DataFileWriter<Complex<long>_> writer;
  DataFileReader<Complex<long>_> reader;
  size_t *local_d8;
  ulong *local_d0;
  assertion_result local_c8;
  ValidSchema dschema;
  size_t number_of_objects;
  const_string local_98;
  lazy_ostream local_88;
  undefined8 *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  size_t **local_50;
  ComplexInteger record;
  
  number_of_objects = 100;
  avro::compileJsonSchemaFromString((char *)&dschema);
  __nbytes = 0x4000;
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            (&writer,this->filename,&dschema,0x4000,DEFLATE_CODEC);
  lVar4 = 0;
  lVar5 = 0;
  do {
    avro::DataFileWriterBase::syncIfNeeded();
    plVar1 = *(long **)((long)writer.base_._M_ptr + 0x30);
    (**(code **)(*plVar1 + 0x38))(plVar1,lVar5);
    (**(code **)(*plVar1 + 0x38))(plVar1,lVar4);
    *(long *)((long)writer.base_._M_ptr + 0x70) = *(long *)((long)writer.base_._M_ptr + 0x70) + 1;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 2;
  } while (lVar5 != 100);
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&writer.base_);
  avro::DataFileReader<Complex<long>_>::DataFileReader(&reader,this->filename,&dschema);
  found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  record.re = 0;
  record.im = 0;
  __buf = extraout_RDX;
  while (sVar3 = avro::DataFileReader<Complex<long>_>::read(&reader,(int)&record,__buf,__nbytes),
        (char)sVar3 != '\0') {
    writer.base_._M_ptr._0_4_ = (int)record.re;
    if (found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&found,(iterator)
                        found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,(int *)&writer);
      __buf = extraout_RDX_01;
    }
    else {
      *found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (int)record.re;
      found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1;
      __buf = extraout_RDX_00;
    }
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1ae;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b9fb8;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = "";
  local_120 = (long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_d0 = &local_120;
  local_d8 = &number_of_objects;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_120 == number_of_objects);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_98.m_end = "";
  writer.base_._M_ptr = (auto_ptr<avro::DataFileWriterBase>)&PTR__lazy_ostream_001ba078;
  local_50 = &local_d8;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001ba078;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_88,&local_98,0x1ae,CHECK,CHECK_EQUAL,2,"found.size()",&writer,
             "number_of_objects",&local_68);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_120 = local_120 & 0xffffffff00000000;
  if (found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1bd8b0,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x19d2e5);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1b0;
      local_88.m_empty = false;
      local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b9fb8;
      local_78 = &boost::unit_test::lazy_ostream::inst;
      local_70 = "";
      local_d0 = (ulong *)(found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + (local_120 & 0xffffffff));
      local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((int)*local_d0 == (int)local_120);
      local_c8.m_message.px = (element_type *)0x0;
      local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_98.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
      ;
      local_98.m_end = "";
      writer.base_._M_ptr = (auto_ptr<avro::DataFileWriterBase>)&PTR__lazy_ostream_001b9ff8;
      local_d8 = &local_120;
      local_60 = 0;
      local_68 = &PTR__lazy_ostream_001ba298;
      local_58 = &boost::unit_test::lazy_ostream::inst;
      local_50 = &local_d8;
      boost::test_tools::tt_detail::report_assertion
                (&local_c8,&local_88,&local_98,0x1b0,CHECK,CHECK_EQUAL,2,"found[i]",&writer,"i",
                 &local_68);
      boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
      uVar2 = (int)local_120 + 1;
      local_120 = CONCAT44(local_120._4_4_,uVar2);
    } while ((ulong)uVar2 <
             (ulong)((long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if (found.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)found.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&reader.base_);
  boost::detail::shared_count::~shared_count(&dschema.root_.pn);
  return;
}

Assistant:

void testZip() {
        const size_t number_of_objects = 100;
        // first create a large file
        ValidSchema dschema = avro::compileJsonSchemaFromString(sch);
        {
            avro::DataFileWriter<ComplexInteger> writer(
              filename, dschema, 16 * 1024, avro::DEFLATE_CODEC);

            for (size_t i = 0; i < number_of_objects; ++i) {
                ComplexInteger d;
                d.re = i;
                d.im = 2 * i;
                writer.write(d);
            }
        }
        {
            avro::DataFileReader<ComplexInteger> reader(filename, dschema);
            std::vector<int> found;
            ComplexInteger record;
            while (reader.read(record)) {
                found.push_back(record.re);
            }
            BOOST_CHECK_EQUAL(found.size(), number_of_objects);
            for (unsigned int i = 0; i < found.size(); ++i) {
                BOOST_CHECK_EQUAL(found[i], i);
            }
        }
    }